

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall LogicalOperationNode::Evaluate(LogicalOperationNode *this,Date *date,string *event)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  byte local_32;
  byte local_31;
  string *event_local;
  Date *date_local;
  LogicalOperationNode *this_local;
  
  if (this->op == Or) {
    peVar3 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->leftOperand);
    uVar1 = (**peVar3->_vptr_Node)(peVar3,date,event);
    local_31 = 1;
    local_32 = local_31;
    if ((uVar1 & 1) == 0) {
      peVar3 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->rightOperand);
      iVar2 = (**peVar3->_vptr_Node)(peVar3,date,event);
      local_32 = (byte)iVar2;
    }
  }
  else {
    peVar3 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->leftOperand);
    uVar1 = (**peVar3->_vptr_Node)(peVar3,date,event);
    local_32 = 0;
    if ((uVar1 & 1) != 0) {
      peVar3 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->rightOperand);
      iVar2 = (**peVar3->_vptr_Node)(peVar3,date,event);
      local_32 = (byte)iVar2;
    }
  }
  this_local._7_1_ = (bool)(local_32 & 1);
  return this_local._7_1_;
}

Assistant:

bool LogicalOperationNode::Evaluate(const Date& date, const string& event) const {
    if (op == LogicalOperation::Or) {
        return leftOperand->Evaluate(date, event) || rightOperand->Evaluate(date, event);
    } else {
        return leftOperand->Evaluate(date, event) && rightOperand->Evaluate(date, event);
    }
}